

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O3

int ffcpsr(fitsfile *infptr,fitsfile *outfptr,LONGLONG firstrow,LONGLONG nrows,char *row_status,
          int *status)

{
  LONGLONG *pLVar1;
  int iVar2;
  int iVar3;
  void *buffer;
  FITSfile *pFVar4;
  long lVar5;
  LONGLONG nrows_00;
  int *piVar6;
  size_t sVar7;
  char *err_message;
  long lVar8;
  long *plVar9;
  int nInVarCols;
  LONGLONG innaxis1;
  int nOutVarCols;
  LONGLONG hrepeat;
  LONGLONG hoffset;
  LONGLONG outnaxis2;
  LONGLONG outnaxis1;
  LONGLONG innaxis2;
  void *local_d8;
  int local_cc;
  uchar *local_c8;
  int *local_c0;
  long local_b8;
  size_t local_b0;
  int local_a4;
  long local_a0;
  int *local_98;
  size_t local_90;
  size_t local_88;
  long local_80;
  long *local_78;
  LONGLONG local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  size_t local_40;
  long local_38;
  
  local_cc = 0;
  local_a4 = 0;
  local_90 = 0;
  local_70 = 0;
  if (0 < *status) {
    return *status;
  }
  if (infptr->HDUposition == infptr->Fptr->curhdu) {
    if (infptr->Fptr->datastart == -1) {
      ffrdef(infptr,status);
    }
  }
  else {
    ffmahd(infptr,infptr->HDUposition + 1,(int *)0x0,status);
  }
  if (outfptr->HDUposition == outfptr->Fptr->curhdu) {
    if (outfptr->Fptr->datastart == -1) {
      ffrdef(outfptr,status);
    }
  }
  else {
    ffmahd(outfptr,outfptr->HDUposition + 1,(int *)0x0,status);
  }
  if (0 < *status) {
    return *status;
  }
  iVar3 = infptr->Fptr->hdutype;
  if ((iVar3 == 0) || (iVar2 = outfptr->Fptr->hdutype, iVar2 == 0)) {
    ffpmsg("Can not copy rows to or from IMAGE HDUs (ffcprw)");
    *status = 0xeb;
    return 0xeb;
  }
  if ((iVar2 == 1 && iVar3 == 2) || (iVar2 == 2 && iVar3 == 1)) {
    ffpmsg("Copying rows between Binary and ASCII tables is not supported (ffcprw)");
    *status = 0xe3;
    return 0xe3;
  }
  ffgkyjj(infptr,"NAXIS1",(LONGLONG *)&local_b0,(char *)0x0,status);
  ffgkyjj(infptr,"NAXIS2",&local_38,(char *)0x0,status);
  ffgkyjj(outfptr,"NAXIS1",(LONGLONG *)&local_40,(char *)0x0,status);
  ffgkyjj(outfptr,"NAXIS2",&local_68,(char *)0x0,status);
  if (0 < *status) {
    return *status;
  }
  if (local_40 != local_b0) {
    ffpmsg("Input and output tables do not have same width (ffcprw)");
    *status = 0xf1;
    return 0xf1;
  }
  if (local_38 < nrows + firstrow + -1) {
    ffpmsg("Not enough rows in input table to copy (ffcprw)");
    *status = 0x133;
    return 0x133;
  }
  iVar3 = infptr->Fptr->tfield;
  if (iVar3 != outfptr->Fptr->tfield) {
    ffpmsg("Input and output tables do not have same number of columns (ffcprw)");
    *status = 0x12e;
    return 0x12e;
  }
  local_c8 = (uchar *)malloc(local_40);
  if (local_c8 == (uchar *)0x0) {
    ffpmsg("Unable to allocate memory (ffcprw)");
    *status = 0x71;
    return 0x71;
  }
  sVar7 = (long)iVar3 << 2;
  local_c0 = (int *)malloc(sVar7);
  local_98 = (int *)malloc(sVar7);
  fffvcl(infptr,&local_cc,local_c0,status);
  fffvcl(outfptr,&local_a4,local_98,status);
  if (local_cc != local_a4) {
LAB_00118239:
    ffpmsg("Input and output tables have different variable columns (ffcprw)");
    *status = 0x12e;
    local_d8 = (void *)0x0;
    goto LAB_00118334;
  }
  if (0 < local_cc) {
    lVar5 = 0;
    do {
      if (local_c0[lVar5] != local_98[lVar5]) goto LAB_00118239;
      lVar5 = lVar5 + 1;
    } while (local_cc != lVar5);
  }
  local_b8 = local_68 + 1;
  if (local_cc == 0) {
    if (nrows < 1) {
LAB_0011830d:
      local_d8 = (void *)0x0;
      lVar5 = 0;
    }
    else {
      lVar5 = 0;
      lVar8 = 0;
      do {
        if ((row_status == (char *)0x0) || (row_status[lVar8] != '\0')) {
          local_a0 = lVar5;
          ffgtbb(infptr,lVar8 + firstrow,1,local_b0,local_c8,status);
          ffptbb(outfptr,local_b8,1,local_b0,local_c8,status);
          lVar5 = local_a0 + 1;
          local_b8 = local_b8 + 1;
        }
        lVar8 = lVar8 + 1;
      } while (nrows != lVar8);
      local_d8 = (void *)0x0;
    }
  }
  else {
    nrows_00 = nrows;
    if (row_status != (char *)0x0) {
      if (nrows < 1) {
        ffirow(outfptr,local_68,0,status);
        goto LAB_0011830d;
      }
      nrows_00 = 0;
      lVar5 = 0;
      do {
        nrows_00 = (nrows_00 + 1) - (ulong)(row_status[lVar5] == '\0');
        lVar5 = lVar5 + 1;
      } while (nrows != lVar5);
    }
    local_a0 = nrows_00;
    ffirow(outfptr,local_68,nrows_00,status);
    if (nrows < 1) {
      local_d8 = (void *)0x0;
      lVar5 = local_a0;
    }
    else {
      local_d8 = (void *)0x0;
      local_88 = 0;
      lVar8 = 0;
      do {
        if ((row_status == (char *)0x0) || (row_status[lVar8] != '\0')) {
          local_60 = lVar8;
          ffgtbb(infptr,firstrow,1,local_b0,local_c8,status);
          ffptbb(outfptr,local_b8,1,local_b0,local_c8,status);
          pFVar4 = infptr->Fptr;
          if (0 < pFVar4->tfield) {
            plVar9 = &pFVar4->tableptr->twidth;
            lVar5 = 0;
            lVar8 = 0;
            piVar6 = local_c0;
            do {
              if (lVar8 < local_cc) {
                iVar3 = piVar6[lVar8];
                lVar5 = lVar5 + 1;
                if (lVar5 == iVar3) {
                  local_78 = plVar9;
                  local_58 = (long)iVar3;
                  local_50 = lVar8;
                  local_48 = lVar5;
                  ffgdesll(infptr,iVar3,firstrow,(LONGLONG *)&local_90,&local_70,status);
                  sVar7 = local_90;
                  if (*(int *)(local_78 + -9) != -0x10) {
                    if (*(int *)(local_78 + -9) == -1) {
                      lVar5 = local_90 + 0xe;
                      if (-1 < (long)(local_90 + 7)) {
                        lVar5 = local_90 + 7;
                      }
                      sVar7 = lVar5 >> 3;
                    }
                    else {
                      sVar7 = local_90 * *local_78;
                    }
                  }
                  pFVar4 = outfptr->Fptr;
                  local_80 = pFVar4->heapstart + pFVar4->datastart + pFVar4->heapsize;
                  ffmbyt(infptr,infptr->Fptr->heapstart + infptr->Fptr->datastart + local_70,0,
                         status);
                  pFVar4 = outfptr->Fptr;
                  if (pFVar4->lasthdu == 0) {
                    if (((long)(local_80 + sVar7) <= pFVar4->headstart[(long)pFVar4->curhdu + 1]) ||
                       (iVar3 = ffiblk(outfptr,(long)(local_80 + sVar7 +
                                                     ~pFVar4->headstart[(long)pFVar4->curhdu + 1]) /
                                               0xb40 + 1,1,status), iVar3 < 1)) goto LAB_0011810c;
                    err_message = "Failed to extend the size of the variable length heap (ffcprw)";
LAB_0011837c:
                    ffpmsg(err_message);
                    goto LAB_00118334;
                  }
LAB_0011810c:
                  if (sVar7 != 0) {
                    buffer = local_d8;
                    if (((long)local_88 < (long)sVar7) &&
                       (buffer = realloc(local_d8,sVar7), local_88 = sVar7, buffer == (void *)0x0))
                    {
                      *status = 0x71;
                      err_message = "failed to allocate memory for variable column copy (ffcprw)";
                      goto LAB_0011837c;
                    }
                    ffgbyt(infptr,sVar7,buffer,status);
                    ffmbyt(outfptr,local_80,1,status);
                    ffpbyt(outfptr,sVar7,buffer,status);
                    local_d8 = buffer;
                  }
                  ffpdes(outfptr,(int)local_58,local_b8,local_90,outfptr->Fptr->heapsize,status);
                  pLVar1 = &outfptr->Fptr->heapsize;
                  *pLVar1 = *pLVar1 + sVar7;
                  lVar8 = local_50 + 1;
                  pFVar4 = infptr->Fptr;
                  piVar6 = local_c0;
                  lVar5 = local_48;
                  plVar9 = local_78;
                }
              }
              else {
                lVar5 = lVar5 + 1;
              }
              plVar9 = plVar9 + 0x14;
            } while (lVar5 < pFVar4->tfield);
          }
          local_b8 = local_b8 + 1;
          lVar8 = local_60;
        }
        lVar8 = lVar8 + 1;
        firstrow = firstrow + 1;
        lVar5 = local_a0;
      } while (lVar8 != nrows);
    }
  }
  local_68 = local_68 + lVar5;
  ffuky(outfptr,0x51,"NAXIS2",&local_68,(char *)0x0,status);
LAB_00118334:
  free(local_c8);
  free(local_c0);
  free(local_98);
  if (local_d8 != (void *)0x0) {
    free(local_d8);
  }
  return *status;
}

Assistant:

int ffcpsr(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           LONGLONG firstrow,   /* I - number of first row to copy (1 based)  */
           LONGLONG nrows,      /* I - number of rows to copy  */
	   char *row_status,    /* I - quality list of rows to keep (1) or not keep (0) */
           int *status)         /* IO - error status     */
/*
  copy consecutive set of rows from infptr and append it in the outfptr table.
*/
{
    LONGLONG innaxis1, innaxis2, outnaxis1, outnaxis2, ii, jj, i0, icol;
    LONGLONG iVarCol, inPos, outPos, nVarBytes, nVarAllocBytes = 0;
    unsigned char *buffer, *varColBuff=0;
    int nInVarCols=0, nOutVarCols=0, varColDiff=0;
    int *inVarCols=0, *outVarCols=0;
    long nNewBlocks;
    LONGLONG hrepeat=0, hoffset=0;
    tcolumn *colptr=0;
    LONGLONG n_good_rows = nrows;
    
    if (*status > 0)
        return(*status);

    if (infptr->HDUposition != (infptr->Fptr)->curhdu)
    {
        ffmahd(infptr, (infptr->HDUposition) + 1, NULL, status);
    }
    else if ((infptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(infptr, status);                /* rescan header */

    if (outfptr->HDUposition != (outfptr->Fptr)->curhdu)
    {
        ffmahd(outfptr, (outfptr->HDUposition) + 1, NULL, status);
    }
    else if ((outfptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(outfptr, status);               /* rescan header */

    if (*status > 0)
        return(*status);

    if ((infptr->Fptr)->hdutype == IMAGE_HDU || (outfptr->Fptr)->hdutype == IMAGE_HDU)
    {
       ffpmsg
       ("Can not copy rows to or from IMAGE HDUs (ffcprw)");
       return(*status = NOT_TABLE);
    }

    if ( ((infptr->Fptr)->hdutype == BINARY_TBL &&  (outfptr->Fptr)->hdutype == ASCII_TBL) ||
         ((infptr->Fptr)->hdutype == ASCII_TBL &&  (outfptr->Fptr)->hdutype == BINARY_TBL) )
    {
       ffpmsg
       ("Copying rows between Binary and ASCII tables is not supported (ffcprw)");
       return(*status = NOT_BTABLE);
    }

    ffgkyjj(infptr,  "NAXIS1", &innaxis1,  0, status);  /* width of input rows */
    ffgkyjj(infptr,  "NAXIS2", &innaxis2,  0, status);  /* no. of input rows */
    ffgkyjj(outfptr, "NAXIS1", &outnaxis1, 0, status);  /* width of output rows */
    ffgkyjj(outfptr, "NAXIS2", &outnaxis2, 0, status);  /* no. of output rows */

    if (*status > 0)
        return(*status);

    if (outnaxis1 != innaxis1) {
       ffpmsg
       ("Input and output tables do not have same width (ffcprw)");
       return(*status = BAD_ROW_WIDTH);
    }    

    if (firstrow + nrows - 1 > innaxis2) {
       ffpmsg
       ("Not enough rows in input table to copy (ffcprw)");
       return(*status = BAD_ROW_NUM);
    }
    
    if ((infptr->Fptr)->tfield != (outfptr->Fptr)->tfield)
    {
       ffpmsg
       ("Input and output tables do not have same number of columns (ffcprw)");
       return(*status = BAD_COL_NUM);
    }
    
    /* allocate buffer to hold 1 row of data */
    buffer = malloc( (size_t) innaxis1);
    if (!buffer) {
       ffpmsg
       ("Unable to allocate memory (ffcprw)");
       return(*status = MEMORY_ALLOCATION);
    }
 
    inVarCols = malloc(infptr->Fptr->tfield*sizeof(int));
    outVarCols = malloc(outfptr->Fptr->tfield*sizeof(int));
    fffvcl(infptr, &nInVarCols, inVarCols, status);
    fffvcl(outfptr, &nOutVarCols, outVarCols, status);
    if (nInVarCols != nOutVarCols)
       varColDiff=1;
    else
    {
       for (ii=0; ii<nInVarCols; ++ii)
       {
          if (inVarCols[ii] != outVarCols[ii])
          {
             varColDiff=1;
             break;
          }
       }
    }
    
    if (varColDiff)
    {
       ffpmsg("Input and output tables have different variable columns (ffcprw)");
       *status = BAD_COL_NUM;
       goto CLEANUP_RETURN;
    }
    
    jj = outnaxis2 + 1;
    if (nInVarCols)
    {
      if (row_status) {
	for (n_good_rows = 0, ii = 0; ii < nrows; ii++) {
	  if (row_status[ii]) n_good_rows++; 
	}
      }

       ffirow(outfptr, outnaxis2, n_good_rows, status);
       for (ii = firstrow, i0 = 0; i0 < nrows; i0++, ii++)
       {
	  /* Ignore rows with row_status[] == 0 */
	  if (row_status && !row_status[i0]) continue;

          fits_read_tblbytes (infptr, ii, 1, innaxis1, buffer, status);
          fits_write_tblbytes(outfptr, jj, 1, innaxis1, buffer, status);
          /* Now make corrections for variable length columns */
          iVarCol=0;
          colptr = (infptr->Fptr)->tableptr;
          for (icol=0; icol<(infptr->Fptr)->tfield; ++icol)
          {
             if (iVarCol < nInVarCols && inVarCols[iVarCol] == icol+1)
             {
                /* Copy from a variable length column */
                
                ffgdesll(infptr, icol+1, ii, &hrepeat, &hoffset, status);
                /* If this is a bit column, hrepeat will be number of
                   bits, not bytes. If it is a string column, hrepeat
		   is the number of bytes, twidth is the max col width 
		   and can be ignored.*/
                if (colptr->tdatatype == -TBIT)
		{
		   nVarBytes = (hrepeat+7)/8;
		}
		else if (colptr->tdatatype == -TSTRING)
		{
		   nVarBytes = hrepeat;
		}
		else
		{
		   nVarBytes = hrepeat*colptr->twidth*sizeof(char);
		}
                inPos = (infptr->Fptr)->datastart + (infptr->Fptr)->heapstart
				+ hoffset;
		outPos = (outfptr->Fptr)->datastart + (outfptr->Fptr)->heapstart
				+ (outfptr->Fptr)->heapsize;
                ffmbyt(infptr, inPos, REPORT_EOF, status);
		/* If this is not the last HDU in the file, then check if */
		/* extending the heap would overwrite the following header. */
		/* If so, then have to insert more blocks. */
                if ( !((outfptr->Fptr)->lasthdu) )
                {
		   if (outPos+nVarBytes > 
		      (outfptr->Fptr)->headstart[(outfptr->Fptr)->curhdu+1])
		   {
		      nNewBlocks = (long)(((outPos+nVarBytes - 1 -
                        (outfptr->Fptr)->headstart[(outfptr->Fptr)->
                        curhdu+1]) / 2880) + 1);
                      if (ffiblk(outfptr, nNewBlocks, 1, status) > 0)
                      {
                         ffpmsg("Failed to extend the size of the variable length heap (ffcprw)");
			 goto CLEANUP_RETURN;
                      }

		   }
                }
                if (nVarBytes)
		{
		   if (nVarBytes > nVarAllocBytes)
		   {
		     /* Grow the copy buffer to accomodate the new maximum size. 
			Note it is safe to call realloc() with null input pointer, 
			which is equivalent to malloc(). */
		     unsigned char *varColBuff1 = (unsigned char *) realloc(varColBuff, nVarBytes);
		     if (! varColBuff1)
		     {
		       *status = MEMORY_ALLOCATION;
		       ffpmsg("failed to allocate memory for variable column copy (ffcprw)");
		       goto CLEANUP_RETURN;
		     }
		     /* Record the new state */
		     varColBuff = varColBuff1;
		     nVarAllocBytes = nVarBytes;
		   }
		   /* Copy date from input to output */
                   ffgbyt(infptr, nVarBytes, varColBuff, status);
		   ffmbyt(outfptr, outPos, IGNORE_EOF, status);
                   ffpbyt(outfptr, nVarBytes, varColBuff, status);
		}
		ffpdes(outfptr, icol+1, jj, hrepeat, (outfptr->Fptr)->heapsize, status);
                (outfptr->Fptr)->heapsize += nVarBytes;
                ++iVarCol;
             }
             ++colptr;
          }
          ++jj;
       }
    }
    else
    {    
       /* copy the rows, 1 at a time */
       n_good_rows = 0;
       for (ii = firstrow, i0 = 0; i0 < nrows; i0++, ii++)
       {
	  /* Ignore rows with row_status[] == 0 */
	  if (row_status && !row_status[i0]) continue;

           fits_read_tblbytes (infptr,  ii, 1, innaxis1, buffer, status);
           fits_write_tblbytes(outfptr, jj, 1, innaxis1, buffer, status);
	   n_good_rows ++;
           jj++;
       }
    }
    outnaxis2 += n_good_rows;
    fits_update_key(outfptr, TLONGLONG, "NAXIS2", &outnaxis2, 0, status);

 CLEANUP_RETURN:
    free(buffer);
    free(inVarCols);
    free(outVarCols);
    if (varColBuff) free(varColBuff);
    return(*status);
}